

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directed_Energy_Fire_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Directed_Energy_Fire_PDU::operator==
          (Directed_Energy_Fire_PDU *this,Directed_Energy_Fire_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if ((((!KVar1) &&
       (KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                          (&this->m_FiringEntityID,&Value->m_FiringEntityID), !KVar1)) &&
      (KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID), !KVar1))
     && ((KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_MunTyp,&Value->m_MunTyp), !KVar1 &&
         (KVar1 = DATA_TYPE::ClockTime::operator!=(&this->m_ShotStartTime,&Value->m_ShotStartTime),
         !KVar1)))) {
    if (((float)this->m_f32CumulativeShotTime == (float)Value->m_f32CumulativeShotTime) &&
       ((!NAN((float)this->m_f32CumulativeShotTime) && !NAN((float)Value->m_f32CumulativeShotTime)
        && (KVar1 = DATA_TYPE::Vector::operator!=(&this->m_EmitterLoc,&Value->m_EmitterLoc), !KVar1)
        ))) {
      if (((float)this->m_f32AperDiameter == (float)Value->m_f32AperDiameter) &&
         (!NAN((float)this->m_f32AperDiameter) && !NAN((float)Value->m_f32AperDiameter))) {
        if (((float)this->m_f32Wavelength == (float)Value->m_f32Wavelength) &&
           (!NAN((float)this->m_f32Wavelength) && !NAN((float)Value->m_f32Wavelength))) {
          if (((float)this->m_f32PeakIrradiance == (float)Value->m_f32PeakIrradiance) &&
             (!NAN((float)this->m_f32PeakIrradiance) && !NAN((float)Value->m_f32PeakIrradiance))) {
            if (((float)this->m_f32PulseRepFreq == (float)Value->m_f32PulseRepFreq) &&
               (!NAN((float)this->m_f32PulseRepFreq) && !NAN((float)Value->m_f32PulseRepFreq))) {
              if (((float)this->m_f32PulseWidth == (float)Value->m_f32PulseWidth) &&
                 ((((!NAN((float)this->m_f32PulseWidth) && !NAN((float)Value->m_f32PulseWidth) &&
                    ((this->m_DeUnion).m_ui16Flags == (Value->m_DeUnion).m_ui16Flags)) &&
                   (this->m_ui8PulseShp == Value->m_ui8PulseShp)) &&
                  (this->m_ui16NumDERecs == Value->m_ui16NumDERecs)))) {
                bVar2 = std::operator!=(&this->m_vDeRec,&Value->m_vDeRec);
                return !bVar2;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

KBOOL Directed_Energy_Fire_PDU::operator == ( const Directed_Energy_Fire_PDU & Value ) const
{
    if( Header::operator        !=( Value ) )                      return false;
    if( m_FiringEntityID        != Value.m_FiringEntityID )        return false;
    if( m_EventID               != Value.m_EventID )               return false;
    if( m_MunTyp                != Value.m_MunTyp )                return false;
    if( m_ShotStartTime         != Value.m_ShotStartTime )         return false;
    if( m_f32CumulativeShotTime != Value.m_f32CumulativeShotTime ) return false;
    if( m_EmitterLoc            != Value.m_EmitterLoc )            return false;
    if( m_f32AperDiameter       != Value.m_f32AperDiameter )       return false;
    if( m_f32Wavelength         != Value.m_f32Wavelength )         return false;
    if( m_f32PeakIrradiance     != Value.m_f32PeakIrradiance )     return false;
    if( m_f32PulseRepFreq       != Value.m_f32PulseRepFreq )       return false;
    if( m_f32PulseWidth         != Value.m_f32PulseWidth )         return false;
    if( m_DeUnion.m_ui16Flags   != Value.m_DeUnion.m_ui16Flags )   return false;
    if( m_ui8PulseShp           != Value.m_ui8PulseShp )           return false;
    if( m_ui16NumDERecs         != Value.m_ui16NumDERecs )         return false;
    if( m_vDeRec                != Value.m_vDeRec )                return false;
    return true;
}